

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::OneofDescriptorProto::~OneofDescriptorProto(OneofDescriptorProto *this)

{
  OneofDescriptorProto *in_RDI;
  
  ~OneofDescriptorProto(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

OneofDescriptorProto::~OneofDescriptorProto() {
  // @@protoc_insertion_point(destructor:google.protobuf.OneofDescriptorProto)
  SharedDtor();
}